

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O0

void __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::ConsiderMarkingResultVar<mp::SOS_1or2_Constraint<1>>
          (Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,SOS_1or2_Constraint<1> *con,int i,ExpressionAcceptanceLevel eal)

{
  bool bVar1;
  FlatModel<mp::DefaultFlatModelParams> *this_00;
  BasicConstraint *in_RSI;
  long in_RDI;
  int in_stack_ffffffffffffffcc;
  
  bVar1 = BasicConstraint::HasResultVar(in_RSI);
  if (bVar1) {
    bVar1 = SOS_1or2_Constraint<1>::IsLogical();
    if (!bVar1) {
      BasicConstraint::GetResultVar(in_RSI);
      bVar1 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::IfVarBoundsStrongerThanInitExpr
                        ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                          *)con,i);
      if (bVar1) {
        return;
      }
    }
    this_00 = (FlatModel<mp::DefaultFlatModelParams> *)(in_RDI + -0x208);
    BasicConstraint::GetResultVar(in_RSI);
    FlatModel<mp::DefaultFlatModelParams>::MarkAsExpression(this_00,in_stack_ffffffffffffffcc);
  }
  return;
}

Assistant:

void ConsiderMarkingResultVar(
      const Con& con, int i, ExpressionAcceptanceLevel eal) {
    assert(ExpressionAcceptanceLevel::NotAccepted!=eal);
    if (con.HasResultVar()) {         // A functional constraint
      assert(                     // Check: the result var has \a con as the init expr
          MPD( template GetInitExpressionOfType<Con>(con.GetResultVar()) )
          == &con);
      if (con.IsLogical()         // Fixed logical results handled differently
          || !MPD( IfVarBoundsStrongerThanInitExpr(con.GetResultVar()) ) )
        MPD( MarkAsExpression(con.GetResultVar()) );   // can be changed later
    }
  }